

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hpp
# Opt level: O0

void __thiscall CJSON::ParseObject(CJSON *this,string *obj)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  mapped_type *this_00;
  CJSONException *pCVar6;
  bool bVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  string local_288;
  string local_268;
  string local_248;
  undefined1 local_221;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  undefined1 local_1da;
  allocator<char> local_1d9;
  string local_1d8;
  string local_1b8;
  string local_198;
  undefined1 local_171;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  string local_c8;
  undefined1 local_a2;
  allocator<char> local_a1;
  string local_a0;
  char *local_70;
  char *end;
  char *beg;
  string local_58 [5];
  bool ValidObject;
  bool KeyValueValid;
  bool ValAllowed;
  string Value;
  string Key;
  string *obj_local;
  CJSON *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&this->m_Values);
  std::__cxx11::string::string((string *)(Value.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_58);
  beg._7_1_ = 0;
  beg._6_1_ = 0;
  beg._5_1_ = 0;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  end = pcVar3;
  lVar4 = std::__cxx11::string::size();
  local_70 = pcVar3 + lVar4;
  do {
    bVar7 = false;
    if (end != local_70) {
      bVar7 = *end != '}';
    }
    if (!bVar7) {
      if (((beg._5_1_ & 1) != 0) && (*end != '}')) {
        pCVar6 = (CJSONException *)__cxa_allocate_exception(0x30);
        CJSONException::CJSONException(pCVar6,INVALID_JSON_OBJECT);
        __cxa_throw(pCVar6,&CJSONException::typeinfo,CJSONException::~CJSONException);
      }
      std::__cxx11::string::~string(local_58);
      std::__cxx11::string::~string((string *)(Value.field_2._M_local_buf + 8));
      return;
    }
    iVar2 = (int)*end;
    if (((1 < iVar2 - 9U) && (1 < iVar2 - 0xcU)) && (iVar2 != 0x20)) {
      if (iVar2 == 0x22) {
        if ((beg._5_1_ & 1) == 0) {
          pCVar6 = (CJSONException *)__cxa_allocate_exception(0x30);
          CJSONException::CJSONException(pCVar6,INVALID_JSON_OBJECT);
          __cxa_throw(pCVar6,&CJSONException::typeinfo,CJSONException::~CJSONException);
        }
        if ((beg._6_1_ & 1) != 0) {
          local_a2 = 1;
          pCVar6 = (CJSONException *)__cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a0,"Missing seperator \',\'.",&local_a1);
          CJSONException::CJSONException(pCVar6,&local_a0,MISSING_SEPERATOR);
          local_a2 = 0;
          __cxa_throw(pCVar6,&CJSONException::typeinfo,CJSONException::~CJSONException);
        }
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          uVar5 = std::__cxx11::string::empty();
          if (((uVar5 & 1) == 0) || ((beg._7_1_ & 1) == 0)) {
            local_129 = 1;
            pCVar6 = (CJSONException *)__cxa_allocate_exception(0x30);
            std::operator+(&local_128,"Missing seperator after \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&Value.field_2 + 8));
            std::operator+(&local_108,&local_128,"\'");
            CJSONException::CJSONException(pCVar6,&local_108,MISSING_SEPERATOR);
            local_129 = 0;
            __cxa_throw(pCVar6,&CJSONException::typeinfo,CJSONException::~CJSONException);
          }
          beg._7_1_ = 0;
          beg._6_1_ = 1;
          ParseString_abi_cxx11_(&local_e8,this,&end,&local_70);
          std::__cxx11::string::operator=(local_58,(string *)&local_e8);
          std::__cxx11::string::~string((string *)&local_e8);
        }
        else {
          ParseString_abi_cxx11_(&local_c8,this,&end,&local_70);
          std::__cxx11::string::operator=
                    ((string *)(Value.field_2._M_local_buf + 8),(string *)&local_c8);
          std::__cxx11::string::~string((string *)&local_c8);
        }
      }
      else if (iVar2 == 0x2c) {
        if ((beg._5_1_ & 1) == 0) {
          pCVar6 = (CJSONException *)__cxa_allocate_exception(0x30);
          CJSONException::CJSONException(pCVar6,INVALID_JSON_OBJECT);
          __cxa_throw(pCVar6,&CJSONException::typeinfo,CJSONException::~CJSONException);
        }
        if ((beg._6_1_ & 1) == 0) {
          local_1da = 1;
          pCVar6 = (CJSONException *)__cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1d8,"Lonly \',\'",&local_1d9);
          CJSONException::CJSONException(pCVar6,&local_1d8,WRONG_PLACED_SEPERATOR);
          local_1da = 0;
          __cxa_throw(pCVar6,&CJSONException::typeinfo,CJSONException::~CJSONException);
        }
        beg._6_1_ = 0;
      }
      else if (iVar2 == 0x3a) {
        if ((beg._5_1_ & 1) == 0) {
          pCVar6 = (CJSONException *)__cxa_allocate_exception(0x30);
          CJSONException::CJSONException(pCVar6,INVALID_JSON_OBJECT);
          __cxa_throw(pCVar6,&CJSONException::typeinfo,CJSONException::~CJSONException);
        }
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) != 0) {
          pCVar6 = (CJSONException *)__cxa_allocate_exception(0x30);
          CJSONException::CJSONException(pCVar6,MISSING_KEY);
          __cxa_throw(pCVar6,&CJSONException::typeinfo,CJSONException::~CJSONException);
        }
        beg._7_1_ = 1;
      }
      else if ((iVar2 == 0x5b) || (iVar2 == 0x7b)) {
        if ((beg._5_1_ & 1) == 0) {
          beg._5_1_ = 1;
        }
        else {
          uVar5 = std::__cxx11::string::empty();
          if ((uVar5 & 1) != 0) {
            pCVar6 = (CJSONException *)__cxa_allocate_exception(0x30);
            CJSONException::CJSONException(pCVar6,MISSING_KEY);
            __cxa_throw(pCVar6,&CJSONException::typeinfo,CJSONException::~CJSONException);
          }
          if ((beg._7_1_ & 1) == 0) {
            local_171 = 1;
            pCVar6 = (CJSONException *)__cxa_allocate_exception(0x30);
            std::operator+(&local_170,"Missing seperator after \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&Value.field_2 + 8));
            std::operator+(&local_150,&local_170,"\'");
            CJSONException::CJSONException(pCVar6,&local_150,MISSING_SEPERATOR);
            local_171 = 0;
            __cxa_throw(pCVar6,&CJSONException::typeinfo,CJSONException::~CJSONException);
          }
          beg._7_1_ = 0;
          beg._6_1_ = 1;
          if (*end == '{') {
            ParseBracketStr_abi_cxx11_(&local_198,this,'{','}',&end,&local_70);
            std::__cxx11::string::operator=(local_58,(string *)&local_198);
            std::__cxx11::string::~string((string *)&local_198);
          }
          else if (*end == '[') {
            ParseBracketStr_abi_cxx11_(&local_1b8,this,'[',']',&end,&local_70);
            std::__cxx11::string::operator=(local_58,(string *)&local_1b8);
            std::__cxx11::string::~string((string *)&local_1b8);
          }
        }
      }
      else {
        if ((beg._5_1_ & 1) == 0) {
          pCVar6 = (CJSONException *)__cxa_allocate_exception(0x30);
          CJSONException::CJSONException(pCVar6,INVALID_JSON_OBJECT);
          __cxa_throw(pCVar6,&CJSONException::typeinfo,CJSONException::~CJSONException);
        }
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) != 0) {
          pCVar6 = (CJSONException *)__cxa_allocate_exception(0x30);
          CJSONException::CJSONException(pCVar6,MISSING_KEY);
          __cxa_throw(pCVar6,&CJSONException::typeinfo,CJSONException::~CJSONException);
        }
        if ((beg._7_1_ & 1) == 0) {
          local_221 = 1;
          pCVar6 = (CJSONException *)__cxa_allocate_exception(0x30);
          std::operator+(&local_220,"Missing seperator after \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&Value.field_2 + 8));
          std::operator+(&local_200,&local_220,"\'");
          CJSONException::CJSONException(pCVar6,&local_200,MISSING_SEPERATOR);
          local_221 = 0;
          __cxa_throw(pCVar6,&CJSONException::typeinfo,CJSONException::~CJSONException);
        }
        beg._7_1_ = 0;
        beg._6_1_ = 1;
        cVar1 = *end;
        if (cVar1 == 'f') {
LAB_00163227:
          ParseBool_abi_cxx11_(&local_248,this,&end,&local_70);
          std::__cxx11::string::operator=(local_58,(string *)&local_248);
          std::__cxx11::string::~string((string *)&local_248);
        }
        else if (cVar1 == 'n') {
          ParseNull_abi_cxx11_(&local_268,this,&end,&local_70);
          std::__cxx11::string::operator=(local_58,(string *)&local_268);
          std::__cxx11::string::~string((string *)&local_268);
        }
        else {
          if (cVar1 == 't') goto LAB_00163227;
          iVar2 = isalnum((int)*end);
          if (((iVar2 == 0) && (*end != '-')) && (*end != '+')) {
            pCVar6 = (CJSONException *)__cxa_allocate_exception(0x30);
            std::operator+(&local_2c8,"Invalid type for key \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&Value.field_2 + 8));
            std::operator+(&local_2a8,&local_2c8,"\'");
            CJSONException::CJSONException(pCVar6,&local_2a8,INVALID_TYPE);
            __cxa_throw(pCVar6,&CJSONException::typeinfo,CJSONException::~CJSONException);
          }
          ParseNum_abi_cxx11_(&local_288,this,&end,&local_70);
          std::__cxx11::string::operator=(local_58,(string *)&local_288);
          std::__cxx11::string::~string((string *)&local_288);
        }
      }
    }
    if ((beg._6_1_ & 1) != 0) {
      beg._7_1_ = 0;
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&this->m_Values,(key_type *)((long)&Value.field_2 + 8));
      std::__cxx11::string::operator=((string *)this_00,local_58);
      std::__cxx11::string::clear();
      std::__cxx11::string::clear();
    }
    if (end != local_70) {
      end = end + 1;
    }
  } while( true );
}

Assistant:

inline void ParseObject(const std::string &obj)
        {
            m_Values.clear();
            std::string Key, Value;
            bool ValAllowed = false;
            bool KeyValueValid = false;
            bool ValidObject = false;

            /*
                Why we use raw pointers instead of iterators or an for loop?
                Because I think its much faster to use pointer arithmetic instead
                of iterator arithmetic or for loops.

                If I'm wrong with my thoughts, please correct me.
             */
            const char *beg = obj.c_str();
            const char *end = beg + obj.size();

            while (beg != end && *beg != '}')
            {
                switch (*beg)
                {
                    // Parses a string.
                    case '\"':
                    {
                        // Throw an exception if we found a string outside of an object.
                        if(!ValidObject)
                            throw CJSONException(JSONErrorType::INVALID_JSON_OBJECT);
                        else if(KeyValueValid)
                            throw CJSONException("Missing seperator ','.", JSONErrorType::MISSING_SEPERATOR);

                        // Quick and dirty check if we need a key or a value.
                        if(Key.empty())
                            Key = ParseString(beg, end);
                        else if(Value.empty() && ValAllowed)
                        {
                            ValAllowed = false;
                            KeyValueValid = true;
                            Value = ParseString(beg, end);
                        }
                        else   // Throw an exception if we doesn't expected a key or value. That occurs always if a colon is missing.
                            throw CJSONException("Missing seperator after '" + Key + "'", JSONErrorType::MISSING_SEPERATOR);                            
                    }break;

                    // Ignore all whitespace characters, which are outside of values.
                    case '\t':
                    case '\n':
                    case '\f':
                    case '\r':
                    case ' ':
                    {

                    }break;

                    // Parses an object or array.
                    case '{':
                    case '[':
                    {
                        // If this is the root object then set the validator flag.
                        if(!ValidObject)
                        {
                            ValidObject = true;
                            break;
                        }

                        // Throws an exception either if the key is missing or a value wasn't expected.
                        if(Key.empty())
                            throw CJSONException(JSONErrorType::MISSING_KEY); 
                        else if(!ValAllowed)
                            throw CJSONException("Missing seperator after '" + Key + "'", JSONErrorType::MISSING_SEPERATOR);  

                        ValAllowed = false;
                        KeyValueValid = true;

                        // Objects and arrays are saved as strings and parsed later.
                        if(*beg == '{')
                            Value = ParseBracketStr('{', '}', beg, end);
                        else if(*beg == '[')
                            Value = ParseBracketStr('[', ']', beg, end);
                    }break;

                    // Allows the next key value pair.
                    case ',': 
                    {
                        if(!ValidObject)
                            throw CJSONException(JSONErrorType::INVALID_JSON_OBJECT);

                        if(!KeyValueValid)
                            throw CJSONException("Lonly ','", JSONErrorType::WRONG_PLACED_SEPERATOR);        

                        KeyValueValid = false;
                    }break;

                    // Allows a value.
                    case ':':
                    {
                        if(!ValidObject)
                            throw CJSONException(JSONErrorType::INVALID_JSON_OBJECT);

                        if(Key.empty())
                            throw CJSONException(JSONErrorType::MISSING_KEY);

                        ValAllowed = true;
                    }break;

                    default:
                    {
                        if(!ValidObject)
                            throw CJSONException(JSONErrorType::INVALID_JSON_OBJECT);

                        if(Key.empty())
                            throw CJSONException(JSONErrorType::MISSING_KEY); 
                        else if(!ValAllowed)
                            throw CJSONException("Missing seperator after '" + Key + "'", JSONErrorType::MISSING_SEPERATOR);  

                        ValAllowed = false;
                        KeyValueValid = true;

                        switch (*beg)
                        {
                            // If a non escaped string begins with t or f it's maybe a boolean.
                            case 't':
                            case 'f':
                            {
                                Value = ParseBool(beg, end);
                            }break;

                            // If a non escaped string begins with n it's maybe a null object.
                            case 'n':
                            {
                                Value = ParseNull(beg, end);
                            }break;

                            default:
                            {
                                // If a non escaped string begins with a number, plus or minus it's maybe a number.
                                if(isalnum(*beg) || *beg == '-' || *beg == '+')
                                    Value = ParseNum(beg, end);
                                else    // Otherwise throw an exception.
                                    throw CJSONException("Invalid type for key '" + Key + "'", JSONErrorType::INVALID_TYPE);
                            }break;
                        }
                    }break;
                }

                // If key and value is set save it for later use.
                if(KeyValueValid)
                {
                    ValAllowed = false;
                    m_Values[Key] = Value;
                    Key.clear();
                    Value.clear();
                }

                if(beg != end)
                    beg++;
            }

            // Validates the object.
            if(ValidObject && *beg != '}')
                throw CJSONException(JSONErrorType::INVALID_JSON_OBJECT);
        }